

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task_scheduler.c
# Opt level: O0

HT_Boolean ht_task_scheduler_remove_task(HT_TaskScheduler *task_scheduler,HT_TaskId task_id)

{
  HT_Task *task_00;
  HT_Task *task;
  size_t i;
  HT_TaskId task_id_local;
  HT_TaskScheduler *task_scheduler_local;
  
  if (-1 < task_id) {
    for (task = (HT_Task *)0x0; task < (HT_Task *)(task_scheduler->tasks).size;
        task = (HT_Task *)((long)&task->callback + 1)) {
      task_00 = (HT_Task *)(task_scheduler->tasks).data[(long)task];
      if (task_00->id == task_id) {
        ht_task_scheduler_remove_task_entry(&task_scheduler->tasks,task_00);
        ht_free(task_00);
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

HT_Boolean
ht_task_scheduler_remove_task(HT_TaskScheduler* task_scheduler, HT_TaskId task_id)
{
    size_t i;

    if (task_id < 0)
    {
        return HT_FALSE;
    }

    for (i = 0; i < task_scheduler->tasks.size; i++)
    {
        HT_Task* task = HT_TASK(task_scheduler->tasks.data[i]);
        if (task->id == task_id)
        {
            ht_task_scheduler_remove_task_entry(&task_scheduler->tasks, task);
            ht_free(task);
            return HT_TRUE;
        }
    }

    return HT_FALSE;
}